

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FpgaIO.cpp
# Opt level: O3

string * __thiscall
FpgaIO::GetFPGASerialNumber_abi_cxx11_(string *__return_storage_ptr__,FpgaIO *this)

{
  bool bVar1;
  char *pcVar2;
  char data [20];
  int local_38;
  char local_34;
  char local_33 [8];
  undefined1 local_2b;
  
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  local_2b = 0;
  bVar1 = PromReadData(this,0x1fff00,(uint8_t *)&local_38,0x10);
  if (bVar1) {
    if (local_34 == ' ' && local_38 == 0x41475046) {
      pcVar2 = strchr(local_33,0xff);
      if (pcVar2 != (char *)0x0) {
        *pcVar2 = '\0';
      }
      pcVar2 = (char *)__return_storage_ptr__->_M_string_length;
      strlen(local_33);
      std::__cxx11::string::_M_replace((ulong)__return_storage_ptr__,0,pcVar2,(ulong)local_33);
    }
  }
  else {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr,
               "FpgaIO::GetFPGASerialNumber: failed to read FPGA Serial Number",0x3e);
    std::ios::widen((char)*(undefined8 *)(std::cerr + -0x18) + -0x58);
    std::ostream::put(-0x58);
    std::ostream::flush();
  }
  return __return_storage_ptr__;
}

Assistant:

std::string FpgaIO::GetFPGASerialNumber(void)
{
    // Format: FPGA 1234-56 (12 bytes) or FPGA 1234-567 (13 bytes).
    // Note that on PROM, the string is terminated by 0xff because the sector
    // is first erased (all bytes set to 0xff) before the string is written.
    uint32_t address = 0x001FFF00;
    char data[20];
    std::string sn;
    const size_t FPGASNSize = 13;
    const size_t bytesToRead = (FPGASNSize+3)&0xFC;  // must be multiple of 4

    data[FPGASNSize] = 0;    // Make sure null-terminated
    if (PromReadData(address, (uint8_t *)data, bytesToRead)) {
        if (strncmp(data, "FPGA ", 5) == 0) {
            char *p = strchr(data+5, 0xff);
            if (p) *p = 0;      // Null terminate at first 0xff
            sn.assign(data+5);
        }
    }
    else
        std::cerr << "FpgaIO::GetFPGASerialNumber: failed to read FPGA Serial Number" << std::endl;
    return sn;
}